

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testIsEmpty<Imath_2_5::Vec2<int>>(char *type)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  int *piVar6;
  char *in_RDI;
  Box<Imath_2_5::Vec2<int>_> b_1;
  Vec2<int> max;
  Vec2<int> min;
  Box<Imath_2_5::Vec2<int>_> b1;
  uint i;
  Vec2<int> p1;
  Vec2<int> p0;
  Box<Imath_2_5::Vec2<int>_> b0;
  Box<Imath_2_5::Vec2<int>_> b;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  Box<Imath_2_5::Vec2<int>_> *in_stack_ffffffffffffff88;
  Box<Imath_2_5::Vec2<int>_> *in_stack_ffffffffffffff90;
  Vec2<int> local_64 [3];
  uint local_4c;
  Vec2<int> local_48;
  Vec2<int> local_40;
  Vec2<int> local_38;
  Vec2<int> local_30 [5];
  char *local_8;
  
  local_8 = in_RDI;
  poVar5 = std::operator<<((ostream *)&std::cout,"    isEmpty() for type ");
  poVar5 = std::operator<<(poVar5,local_8);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            ((Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::isEmpty(in_stack_ffffffffffffff88);
  if (!bVar2) {
    __assert_fail("b.isEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x2e8,
                  "void (anonymous namespace)::testIsEmpty(const char *) [T = Imath_2_5::Vec2<int>]"
                 );
  }
  Imath_2_5::Vec2<int>::Vec2(local_30,-1);
  Imath_2_5::Vec2<int>::Vec2(&local_38,1);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            (in_stack_ffffffffffffff90,&in_stack_ffffffffffffff88->min,
             (Vec2<int> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::isEmpty(in_stack_ffffffffffffff88);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b0.isEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x2f3,
                  "void (anonymous namespace)::testIsEmpty(const char *) [T = Imath_2_5::Vec2<int>]"
                 );
  }
  Imath_2_5::Vec2<int>::Vec2(&local_40);
  Imath_2_5::Vec2<int>::Vec2(&local_48);
  local_4c = 0;
  while( true ) {
    uVar4 = local_4c;
    uVar3 = Imath_2_5::Vec2<int>::dimensions();
    if (uVar3 <= uVar4) break;
    cVar1 = (char)local_4c;
    piVar6 = Imath_2_5::Vec2<int>::operator[](&local_40,local_4c);
    *piVar6 = -(1 << (cVar1 + 1U & 0x1f));
    uVar4 = Imath_2_5::Vec2<int>::dimensions();
    cVar1 = (char)local_4c;
    piVar6 = Imath_2_5::Vec2<int>::operator[](&local_48,local_4c);
    *piVar6 = 1 << ((char)uVar4 - cVar1 & 0x1fU);
    local_4c = local_4c + 1;
  }
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            (in_stack_ffffffffffffff90,&in_stack_ffffffffffffff88->min,
             (Vec2<int> *)CONCAT44(in_stack_ffffffffffffff84,uVar4));
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::isEmpty(in_stack_ffffffffffffff88);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b1.isEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x2fd,
                  "void (anonymous namespace)::testIsEmpty(const char *) [T = Imath_2_5::Vec2<int>]"
                 );
  }
  Imath_2_5::Vec2<int>::Vec2(local_64,0);
  Imath_2_5::Vec2<int>::Vec2((Vec2<int> *)&stack0xffffffffffffff94,local_64);
  uVar3 = Imath_2_5::Vec2<int>::dimensions();
  piVar6 = Imath_2_5::Vec2<int>::operator[]((Vec2<int> *)&stack0xffffffffffffff94,uVar3 - 1);
  *piVar6 = 2;
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            (in_stack_ffffffffffffff90,&in_stack_ffffffffffffff88->min,
             (Vec2<int> *)CONCAT44(in_stack_ffffffffffffff84,uVar4));
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::isEmpty(in_stack_ffffffffffffff88);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.isEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x30e,
                  "void (anonymous namespace)::testIsEmpty(const char *) [T = Imath_2_5::Vec2<int>]"
                 );
  }
  return;
}

Assistant:

void
testIsEmpty(const char *type)
{
    cout << "    isEmpty() for type " << type << endl;

    //
    // Empty box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert(b.isEmpty());
    }

    //
    // Non-empty, has-volume box.
    //    2D: [(-2, -4),         ( 8,  2)       ]
    //    3D: [(-2, -4, -6),     (12,  8, 2)    ]
    //    4D: [(-2, -4, -6, -8), (16, 12, 8, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0(T(-1), T(1));
        assert(!b0.isEmpty());

        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions(); i++)
        {
           p0[i] = -typename T::BaseType(1 << (i + 1));
           p1[i] =  typename T::BaseType(1 << (T::dimensions() - i));
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1(p0, p1);
        assert(!b1.isEmpty());
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 2)      ]
    //    3D: [(0, 0, 0),    (0, 0, 2)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 2)]
    //
    {
        T min(0);
        T max = min;
        max[T::dimensions() - 1] = 2;

        IMATH_INTERNAL_NAMESPACE::Box<T> b(min, max);

        assert(!b.isEmpty());
    }
}